

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

bool ImGui_ImplGlfw_Init(GLFWwindow *window,bool install_callbacks,GlfwClientApi client_api)

{
  ImGuiIO *pIVar1;
  ImGui_ImplGlfw_Data *this;
  undefined8 *puVar2;
  GLFWerrorfun cbfun;
  GLFWcursor *pGVar3;
  undefined4 in_EDX;
  byte in_SIL;
  undefined8 in_RDI;
  GLFWerrorfun prev_error_callback;
  ImGui_ImplGlfw_Data *bd;
  ImGuiIO *io;
  size_t in_stack_ffffffffffffffb0;
  
  pIVar1 = ImGui::GetIO();
  this = (ImGui_ImplGlfw_Data *)ImGui::MemAlloc(in_stack_ffffffffffffffb0);
  puVar2 = (undefined8 *)operator_new(0xb8);
  ImGui_ImplGlfw_Data::ImGui_ImplGlfw_Data(this);
  pIVar1->BackendPlatformUserData = puVar2;
  pIVar1->BackendPlatformName = "imgui_impl_glfw";
  pIVar1->BackendFlags = pIVar1->BackendFlags | 2;
  pIVar1->BackendFlags = pIVar1->BackendFlags | 4;
  *puVar2 = in_RDI;
  puVar2[2] = 0;
  pIVar1->SetClipboardTextFn = ImGui_ImplGlfw_SetClipboardText;
  pIVar1->GetClipboardTextFn = ImGui_ImplGlfw_GetClipboardText;
  pIVar1->ClipboardUserData = (void *)*puVar2;
  cbfun = glfwSetErrorCallback((GLFWerrorfun)0x0);
  pGVar3 = glfwCreateStandardCursor(0);
  puVar2[4] = pGVar3;
  pGVar3 = glfwCreateStandardCursor(0);
  puVar2[5] = pGVar3;
  pGVar3 = glfwCreateStandardCursor(0);
  puVar2[7] = pGVar3;
  pGVar3 = glfwCreateStandardCursor(0);
  puVar2[8] = pGVar3;
  pGVar3 = glfwCreateStandardCursor(0);
  puVar2[0xb] = pGVar3;
  pGVar3 = glfwCreateStandardCursor(0);
  puVar2[6] = pGVar3;
  pGVar3 = glfwCreateStandardCursor(0);
  puVar2[9] = pGVar3;
  pGVar3 = glfwCreateStandardCursor(0);
  puVar2[10] = pGVar3;
  pGVar3 = glfwCreateStandardCursor(0);
  puVar2[0xc] = pGVar3;
  glfwSetErrorCallback(cbfun);
  glfwGetError((char **)this);
  if ((in_SIL & 1) != 0) {
    ImGui_ImplGlfw_InstallCallbacks((GLFWwindow *)this);
  }
  *(undefined4 *)(puVar2 + 1) = in_EDX;
  return true;
}

Assistant:

static bool ImGui_ImplGlfw_Init(GLFWwindow* window, bool install_callbacks, GlfwClientApi client_api)
{
    ImGuiIO& io = ImGui::GetIO();
    IM_ASSERT(io.BackendPlatformUserData == nullptr && "Already initialized a platform backend!");
    //printf("GLFW_VERSION: %d.%d.%d (%d)", GLFW_VERSION_MAJOR, GLFW_VERSION_MINOR, GLFW_VERSION_REVISION, GLFW_VERSION_COMBINED);

    // Setup backend capabilities flags
    ImGui_ImplGlfw_Data* bd = IM_NEW(ImGui_ImplGlfw_Data)();
    io.BackendPlatformUserData = (void*)bd;
    io.BackendPlatformName = "imgui_impl_glfw";
    io.BackendFlags |= ImGuiBackendFlags_HasMouseCursors;         // We can honor GetMouseCursor() values (optional)
    io.BackendFlags |= ImGuiBackendFlags_HasSetMousePos;          // We can honor io.WantSetMousePos requests (optional, rarely used)

    bd->Window = window;
    bd->Time = 0.0;

    io.SetClipboardTextFn = ImGui_ImplGlfw_SetClipboardText;
    io.GetClipboardTextFn = ImGui_ImplGlfw_GetClipboardText;
    io.ClipboardUserData = bd->Window;

    // Set platform dependent data in viewport
#if defined(_WIN32)
    ImGui::GetMainViewport()->PlatformHandleRaw = (void*)glfwGetWin32Window(bd->Window);
#endif

    // Create mouse cursors
    // (By design, on X11 cursors are user configurable and some cursors may be missing. When a cursor doesn't exist,
    // GLFW will emit an error which will often be printed by the app, so we temporarily disable error reporting.
    // Missing cursors will return nullptr and our _UpdateMouseCursor() function will use the Arrow cursor instead.)
    GLFWerrorfun prev_error_callback = glfwSetErrorCallback(nullptr);
    bd->MouseCursors[ImGuiMouseCursor_Arrow] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
    bd->MouseCursors[ImGuiMouseCursor_TextInput] = glfwCreateStandardCursor(GLFW_IBEAM_CURSOR);
    bd->MouseCursors[ImGuiMouseCursor_ResizeNS] = glfwCreateStandardCursor(GLFW_VRESIZE_CURSOR);
    bd->MouseCursors[ImGuiMouseCursor_ResizeEW] = glfwCreateStandardCursor(GLFW_HRESIZE_CURSOR);
    bd->MouseCursors[ImGuiMouseCursor_Hand] = glfwCreateStandardCursor(GLFW_HAND_CURSOR);
#if GLFW_HAS_NEW_CURSORS
    bd->MouseCursors[ImGuiMouseCursor_ResizeAll] = glfwCreateStandardCursor(GLFW_RESIZE_ALL_CURSOR);
    bd->MouseCursors[ImGuiMouseCursor_ResizeNESW] = glfwCreateStandardCursor(GLFW_RESIZE_NESW_CURSOR);
    bd->MouseCursors[ImGuiMouseCursor_ResizeNWSE] = glfwCreateStandardCursor(GLFW_RESIZE_NWSE_CURSOR);
    bd->MouseCursors[ImGuiMouseCursor_NotAllowed] = glfwCreateStandardCursor(GLFW_NOT_ALLOWED_CURSOR);
#else
    bd->MouseCursors[ImGuiMouseCursor_ResizeAll] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
    bd->MouseCursors[ImGuiMouseCursor_ResizeNESW] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
    bd->MouseCursors[ImGuiMouseCursor_ResizeNWSE] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
    bd->MouseCursors[ImGuiMouseCursor_NotAllowed] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
#endif
    glfwSetErrorCallback(prev_error_callback);
#if (GLFW_VERSION_COMBINED >= 3300) // Eat errors (see #5785)
    (void)glfwGetError(NULL);
#endif

    // Chain GLFW callbacks: our callbacks will call the user's previously installed callbacks, if any.
    if (install_callbacks)
        ImGui_ImplGlfw_InstallCallbacks(window);

    bd->ClientApi = client_api;
    return true;
}